

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall Clasp::SatBuilder::addClause(SatBuilder *this,LitVec *clause,wsum_t cw)

{
  LitVec *this_00;
  pointer pLVar1;
  uint uVar2;
  Var VVar3;
  bool bVar4;
  Result RVar5;
  Memcpy<Clasp::Literal> local_30;
  
  bVar4 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if (bVar4) {
    bVar4 = satisfied(this,clause);
    if (!bVar4) {
      if ((-1 < cw) && (this->hardWeight_ == cw || cw < 0x80000000)) {
        if (this->hardWeight_ == cw) {
          local_30.first_ = (Literal *)((ulong)local_30.first_._4_4_ << 0x20);
          bVar4 = false;
          RVar5 = ClauseCreator::create
                            (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,clause,0,
                             (ConstraintInfo *)&local_30);
          if (((undefined1  [16])RVar5 & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
            bVar4 = markAssigned(this);
          }
        }
        else {
          this_00 = &this->softClauses_;
          local_30.first_._0_4_ = (uint)cw;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (this_00,(Literal *)&local_30);
          uVar2 = (clause->ebo_).size;
          if (uVar2 < 2) {
            if (uVar2 == 0) {
              local_30.first_._0_4_ = 0;
            }
            else {
              local_30.first_._0_4_ = (clause->ebo_).buf[uVar2 - 1].rep_ & 0xfffffffe ^ 2;
            }
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (this_00,(Literal *)&local_30);
          }
          else {
            VVar3 = this->vars_;
            this->vars_ = VVar3 + 1;
            local_30.first_._0_4_ = VVar3 * 4 + 4;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (this_00,(Literal *)&local_30);
            local_30.first_ = (clause->ebo_).buf;
            bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
            insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
                      ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)this_00,
                       (this->softClauses_).ebo_.buf + (this->softClauses_).ebo_.size,
                       (clause->ebo_).size,&local_30);
          }
          pLVar1 = (this->softClauses_).ebo_.buf + ((this->softClauses_).ebo_.size - 1);
          pLVar1->rep_ = pLVar1->rep_ | 1;
          bVar4 = true;
        }
        return bVar4;
      }
      Potassco::fail(-2,"bool Clasp::SatBuilder::addClause(LitVec &, wsum_t)",0x88,
                     "cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_)",
                     "Clause weight out of bounds",0);
    }
  }
  bVar4 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  return bVar4;
}

Assistant:

bool SatBuilder::addClause(LitVec& clause, wsum_t cw) {
	if (!ctx()->ok() || satisfied(clause)) { return ctx()->ok(); }
	POTASSCO_REQUIRE(cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_), "Clause weight out of bounds");
	if (cw == hardWeight_) {
		return ClauseCreator::create(*ctx()->master(), clause, Constraint_t::Static).ok() && markAssigned();
	}
	else {
		// Store weight, relaxation var, and (optionally) clause
		softClauses_.push_back(Literal::fromRep((uint32)cw));
		if      (clause.size() > 1){ softClauses_.push_back(posLit(++vars_)); softClauses_.insert(softClauses_.end(), clause.begin(), clause.end()); }
		else if (!clause.empty())  { softClauses_.push_back(~clause.back());  }
		else                       { softClauses_.push_back(lit_true()); }
		softClauses_.back().flag(); // mark end of clause
	}
	return true;
}